

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eng_openssl.c
# Opt level: O0

int test_rc4_init_key(EVP_CIPHER_CTX *ctx,uchar *key,uchar *iv,int enc)

{
  void *pvVar1;
  uchar *data;
  void *in_RSI;
  EVP_CIPHER_CTX *in_RDI;
  int n;
  EVP_CIPHER_CTX *in_stack_00000060;
  undefined4 local_4;
  
  local_4 = EVP_CIPHER_CTX_get_key_length(in_stack_00000060);
  if (0 < local_4) {
    pvVar1 = EVP_CIPHER_CTX_get_cipher_data(in_RDI);
    memcpy(pvVar1,in_RSI,(long)local_4);
    pvVar1 = EVP_CIPHER_CTX_get_cipher_data(in_RDI);
    data = (uchar *)EVP_CIPHER_CTX_get_cipher_data(in_RDI);
    RC4_set_key((RC4_KEY *)((long)pvVar1 + 0x10),local_4,data);
    local_4 = 1;
  }
  return local_4;
}

Assistant:

static int test_rc4_init_key(EVP_CIPHER_CTX *ctx, const unsigned char *key,
                             const unsigned char *iv, int enc)
{
    const int n = EVP_CIPHER_CTX_get_key_length(ctx);

# ifdef TEST_ENG_OPENSSL_RC4_P_INIT
    fprintf(stderr, "(TEST_ENG_OPENSSL_RC4) test_init_key() called\n");
# endif
    if (n <= 0)
        return n;
    memcpy(&test(ctx)->key[0], key, n);
    RC4_set_key(&test(ctx)->ks, n, test(ctx)->key);
    return 1;
}